

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiScissor *s)

{
  QDebug *__n;
  array<int,_4UL> *this;
  QDebug *this_00;
  char *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  array<int,_4UL> r;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QRhiScissor *in_stack_ffffffffffffff88;
  array<int,_4UL> *in_stack_ffffffffffffff90;
  QDebug *in_stack_ffffffffffffff98;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_20,in_RSI);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])QRhiScissor::scissor(in_stack_ffffffffffffff88);
  QDebug::nospace(in_RSI);
  __n = QDebug::operator<<(in_stack_ffffffffffffff98,in_RDX);
  std::array<int,_4UL>::operator[](in_stack_ffffffffffffff90,(size_type)__n);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff7c);
  this = (array<int,_4UL> *)QDebug::operator<<(in_stack_ffffffffffffff98,in_RDX);
  std::array<int,_4UL>::operator[](this,(size_type)__n);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff7c);
  this_00 = QDebug::operator<<(in_stack_ffffffffffffff98,in_RDX);
  std::array<int,_4UL>::operator[](this,(size_type)__n);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff7c);
  QDebug::operator<<(this_00,in_RDX);
  std::array<int,_4UL>::operator[](this,(size_type)__n);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff7c);
  QDebug::operator<<((QDebug *)in_RDI,(char)((uint)in_stack_ffffffffffffff7c >> 0x18));
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiScissor &s)
{
    QDebugStateSaver saver(dbg);
    const std::array<int, 4> r = s.scissor();
    dbg.nospace() << "QRhiScissor(bottom-left-x=" << r[0]
                  << " bottom-left-y=" << r[1]
                  << " width=" << r[2]
                  << " height=" << r[3]
                  << ')';
    return dbg;
}